

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Matchers::Impl::StdString::Contains::~Contains(Contains *this)

{
  (this->
  super_MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Contains_0016ef90;
  std::__cxx11::string::~string((string *)&(this->m_data).m_str);
  return;
}

Assistant:

Matchers::Impl::StdString::Contains::~Contains() {}